

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Crc32.cpp
# Opt level: O1

uint32_t crc32_1byte(void *data,size_t length,uint32_t previousCrc32)

{
  uint uVar1;
  size_t sVar2;
  
  if (length != 0) {
    uVar1 = ~previousCrc32;
    sVar2 = 0;
    do {
      uVar1 = uVar1 >> 8 ^ Crc32Lookup[0][(uint)*(byte *)((long)data + sVar2) ^ uVar1 & 0xff];
      sVar2 = sVar2 + 1;
    } while (length != sVar2);
    previousCrc32 = ~uVar1;
  }
  return previousCrc32;
}

Assistant:

uint32_t crc32_1byte(const void* data, size_t length, uint32_t previousCrc32 = 0)
{
  uint32_t crc = ~previousCrc32; // same as previousCrc32 ^ 0xFFFFFFFF
  const uint8_t* current = (const uint8_t*) data;

  while (length-- > 0)
    crc = (crc >> 8) ^ Crc32Lookup[0][(crc & 0xFF) ^ *current++];

  return ~crc; // same as crc ^ 0xFFFFFFFF
}